

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSpectra.cpp
# Opt level: O0

double TestSpectra::B8_spectrum(double xMin,double xMax)

{
  double dVar1;
  double dVar2;
  double dVar3;
  initializer_list<double> __l;
  pointer pdVar4;
  RandomGen *pRVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> local_98;
  double local_80;
  double FuncValue;
  allocator<double> local_61;
  double local_60;
  double local_58;
  undefined8 local_50;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  vector<double,_std::allocator<double>_> xyTry;
  double yMax;
  double xMax_local;
  double xMin_local;
  
  if ((xMax != 4.0) || (yMax = xMax, NAN(xMax))) {
    yMax = 4.0;
  }
  if ((xMin != 0.0) || (xMax_local = xMin, NAN(xMin))) {
    xMax_local = 0.0;
  }
  xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)pow(10.0,-2.198);
  pRVar5 = RandomGen::rndm();
  dVar1 = RandomGen::rand_uniform(pRVar5);
  pdVar4 = xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  local_60 = (yMax - xMax_local) * dVar1 + xMax_local;
  pRVar5 = RandomGen::rndm();
  local_58 = RandomGen::rand_uniform(pRVar5);
  local_58 = (double)pdVar4 * local_58;
  local_50 = 0x3ff0000000000000;
  local_48 = &local_60;
  local_40 = 3;
  std::allocator<double>::allocator(&local_61);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_38,__l,&local_61);
  std::allocator<double>::~allocator(&local_61);
  while (pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)local_38,2), 0.0 < *pvVar6)
  {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,0);
    dVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,0);
    dVar2 = pow(*pvVar6,2.0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,0);
    dVar3 = pow(*pvVar6,3.0);
    local_80 = dVar3 * 0.12441 + dVar2 * -0.32849 + dVar1 * 1.2184 + 2.198;
    local_80 = pow(10.0,-local_80);
    pRVar5 = RandomGen::rndm();
    pdVar4 = xyTry.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,0);
    dVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_38,1);
    RandomGen::VonNeumann
              (&local_98,pRVar5,xMax_local,yMax,0.0,(double)pdVar4,dVar1,*pvVar6,local_80);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)local_38,&local_98);
    std::vector<double,_std::allocator<double>_>::~vector(&local_98);
  }
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_38,0);
  dVar1 = *pvVar6;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_38);
  return dVar1;
}

Assistant:

double TestSpectra::B8_spectrum(double xMin, double xMax) {
  if (xMax != 4.) xMax = 4.;
  if (xMin != 0.) xMin = 0.;
  double yMax = pow(10., -2.198);
  vector<double> xyTry = {
      xMin + (xMax - xMin) * RandomGen::rndm()->rand_uniform(),
      yMax * RandomGen::rndm()->rand_uniform(), 1.};
  while (xyTry[2] > 0.) {
    double FuncValue = 2.198 + 1.2184 * xyTry[0] - 0.32849 * pow(xyTry[0], 2.) +
                       0.12441 * pow(xyTry[0], 3.);
    FuncValue = pow(10., -FuncValue);
    xyTry = RandomGen::rndm()->VonNeumann(xMin, xMax, 0., yMax, xyTry[0],
                                          xyTry[1], FuncValue);
  }
  return xyTry[0];
}